

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O1

Entry * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::
lockEntriesAndGrowIfNeeded
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this,
          size_t *newMemUsed)

{
  pointer *pppEVar1;
  iterator __position;
  uint uVar2;
  bool bVar3;
  ulong *puVar4;
  Entry *in_RCX;
  size_t sVar5;
  ulong uVar6;
  Entry *pEVar7;
  ulong uVar8;
  Entry *pEVar9;
  uint32_t uVar10;
  size_t sVar11;
  bool bVar12;
  Entry *pEStack_28;
  
  do {
    pEVar7 = this->_entries;
    if (pEVar7 == (Entry *)0x0) {
LAB_003b3ba0:
      bVar3 = true;
      pEVar7 = in_RCX;
    }
    else {
      bVar3 = false;
      LOCK();
      bVar12 = pEVar7 == this->_entries;
      if (bVar12) {
        this->_entries = (Entry *)0x0;
      }
      UNLOCK();
      if (!bVar12) goto LAB_003b3ba0;
    }
    in_RCX = pEVar7;
    if (!bVar3) {
      if (this->_numEntries <= this->_size * 2) {
        __position._M_current =
             (this->_oldEntries).
             super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pEStack_28 = in_RCX;
        if (__position._M_current ==
            (this->_oldEntries).
            super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,Ptex::v2_2::PtexCachedReader*>::Entry*,std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,Ptex::v2_2::PtexCachedReader*>::Entry*>>
          ::
          _M_realloc_insert<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,Ptex::v2_2::PtexCachedReader*>::Entry*const&>
                    ((vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,Ptex::v2_2::PtexCachedReader*>::Entry*,std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,Ptex::v2_2::PtexCachedReader*>::Entry*>>
                      *)&this->_oldEntries,__position,&pEStack_28);
        }
        else {
          *__position._M_current = in_RCX;
          pppEVar1 = &(this->_oldEntries).
                      super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
        uVar2 = this->_numEntries * 2;
        sVar11 = (ulong)uVar2 * 0x20;
        puVar4 = (ulong *)operator_new__(sVar11 + 8);
        *puVar4 = (ulong)uVar2;
        if (uVar2 != 0) {
          sVar5 = 0;
          do {
            *(undefined8 *)((long)puVar4 + sVar5 + 8) = 0;
            *(undefined4 *)((long)puVar4 + sVar5 + 0x10) = 0;
            *(undefined4 *)((long)puVar4 + sVar5 + 0x14) = 0;
            *(undefined1 *)((long)puVar4 + sVar5 + 0x18) = 0;
            *(undefined8 *)((long)puVar4 + sVar5 + 0x20) = 0;
            sVar5 = sVar5 + 0x20;
          } while (sVar11 != sVar5);
        }
        *newMemUsed = sVar11;
        if (this->_numEntries != 0) {
          uVar6 = 0;
          do {
            if (pEStack_28[uVar6].value != (PtexCachedReader *)0x0) {
              pEVar7 = pEStack_28 + uVar6;
              uVar10 = (pEVar7->key)._hash;
              do {
                uVar8 = (ulong)(uVar10 & uVar2 - 1);
                uVar10 = uVar10 + 1;
              } while (puVar4[uVar8 * 4 + 4] != 0);
              pEVar9 = (Entry *)(puVar4 + 1) + uVar8;
              (pEVar9->key)._val = (pEVar7->key)._val;
              (pEVar9->key)._len = (pEVar7->key)._len;
              (pEVar9->key)._hash = (pEVar7->key)._hash;
              (pEVar9->key)._ownsVal = (pEVar7->key)._ownsVal;
              (pEVar7->key)._ownsVal = false;
              pEVar9->value = pEVar7->value;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < this->_numEntries);
        }
        this->_numEntries = uVar2;
        return (Entry *)(puVar4 + 1);
      }
      return in_RCX;
    }
  } while( true );
}

Assistant:

Entry* lockEntriesAndGrowIfNeeded(size_t& newMemUsed)
    {
        Entry* entries = lockEntries();
        if (_size*2 >= _numEntries) {
            entries = grow(entries, newMemUsed);
        }
        return entries;
    }